

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FState * __thiscall
FStateLabelStorage::GetState(FStateLabelStorage *this,int pos,PClassActor *cls,bool exact)

{
  int numnames;
  bool bVar1;
  uint index_00;
  uchar *puVar2;
  int *piVar3;
  FName *names;
  FState *pFVar4;
  FState *local_68;
  FName *labels;
  FState *state_1;
  int val;
  FState *state;
  FName local_30;
  int index;
  PClassActor *pPStack_28;
  bool exact_local;
  PClassActor *cls_local;
  FStateLabelStorage *pFStack_18;
  int pos_local;
  FStateLabelStorage *this_local;
  
  index._3_1_ = exact;
  pPStack_28 = cls;
  pFStack_18 = this;
  if (pos < 0x10000001) {
    if (pos < 0) {
      index_00 = pos >> 0x10 & 0x7fff;
      cls_local._4_4_ = ((pos & 0xffffU) - 1) * 4;
      puVar2 = TArray<unsigned_char,_unsigned_char>::operator[]
                         (&this->Storage,(long)cls_local._4_4_ + 4);
      pFVar4 = *(FState **)puVar2;
      bVar1 = VerifyJumpTarget(pPStack_28,pFVar4,index_00);
      if (bVar1) {
        this_local = (FStateLabelStorage *)(pFVar4 + (int)index_00);
      }
      else {
        this_local = (FStateLabelStorage *)0x0;
      }
    }
    else {
      if (0 < pos) {
        cls_local._4_4_ = (pos + -1) * 4;
        piVar3 = (int *)TArray<unsigned_char,_unsigned_char>::operator[]
                                  (&this->Storage,(long)cls_local._4_4_);
        numnames = *piVar3;
        if (numnames == 0) {
          puVar2 = TArray<unsigned_char,_unsigned_char>::operator[]
                             (&this->Storage,(long)cls_local._4_4_ + 4);
          return *(FState **)puVar2;
        }
        if (pPStack_28 != (PClassActor *)0x0) {
          names = (FName *)TArray<unsigned_char,_unsigned_char>::operator[]
                                     (&this->Storage,(long)cls_local._4_4_ + 4);
          pFVar4 = PClassActor::FindState(pPStack_28,numnames,names,(bool)(index._3_1_ & 1));
          return pFVar4;
        }
      }
      this_local = (FStateLabelStorage *)0x0;
    }
  }
  else {
    if (cls == (PClassActor *)0x0) {
      local_68 = (FState *)0x0;
    }
    else {
      cls_local._4_4_ = pos;
      FName::FName(&local_30,pos + 0xf0000000);
      local_68 = PClassActor::FindState(cls,&local_30);
    }
    this_local = (FStateLabelStorage *)local_68;
  }
  return (FState *)this_local;
}

Assistant:

FState *FStateLabelStorage::GetState(int pos, PClassActor *cls, bool exact)
{
	if (pos > 0x10000000)
	{
		return cls? cls->FindState(ENamedName(pos - 0x10000000)) : nullptr;
	}
	else if (pos < 0)
	{
		// decode the combined value produced by the script.
		int index = (pos >> 16) & 32767;
		pos = ((pos & 65535) - 1) * 4;
		FState *state;
		memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
		if (VerifyJumpTarget(cls, state, index))
			return state + index;
		else
			return nullptr;
	}
	else if (pos > 0)
	{
		int val;
		pos = (pos - 1) * 4;
		memcpy(&val, &Storage[pos], sizeof(int));

		if (val == 0)
		{
			FState *state;
			memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
			return state;
		}
		else if (cls != nullptr)
		{
			FName *labels = (FName*)&Storage[pos + sizeof(int)];
			return cls->FindState(val, labels, exact);
		}
	}
	return nullptr;
}